

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void SetWindowIcon(Image image)

{
  GLFWimage icon [1];
  int in_stack_0000001c;
  GLFWimage local_18;
  
  if (icon[0].pixels == (uchar *)0x0) {
    glfwSetWindowIcon(platform.handle,0,(GLFWimage *)0x0);
    return;
  }
  if (in_stack_0000001c == 7) {
    glfwSetWindowIcon(platform.handle,1,&local_18);
    return;
  }
  TraceLog(4,"GLFW: Window icon image must be in R8G8B8A8 pixel format");
  return;
}

Assistant:

void SetWindowIcon(Image image)
{
    if (image.data == NULL)
    {
        // Revert to the default window icon, pass in an empty image array
        glfwSetWindowIcon(platform.handle, 0, NULL);
    }
    else
    {
        if (image.format == PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)
        {
            GLFWimage icon[1] = { 0 };

            icon[0].width = image.width;
            icon[0].height = image.height;
            icon[0].pixels = (unsigned char *)image.data;

            // NOTE 1: We only support one image icon
            // NOTE 2: The specified image data is copied before this function returns
            glfwSetWindowIcon(platform.handle, 1, icon);
        }
        else TRACELOG(LOG_WARNING, "GLFW: Window icon image must be in R8G8B8A8 pixel format");
    }
}